

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

int dump_cb(void *sysdata,void *userdata)

{
  int iVar1;
  prf_nodeinfo_t *ppVar2;
  long in_RDI;
  prf_nodeinfo_t *nodeinfo;
  prf_state_t *state;
  int local_28;
  undefined4 in_stack_ffffffffffffffdc;
  
  ppVar2 = prf_nodeinfo_get((uint16_t)((uint)in_stack_ffffffffffffffdc >> 0x10));
  if ((int)((uint)*(ushort *)(in_RDI + 0x76) * 2) < 0) {
    iVar1 = (uint)*(ushort *)(in_RDI + 0x76) * -2;
  }
  else {
    iVar1 = (uint)*(ushort *)(in_RDI + 0x76) << 1;
  }
  dump_cb::dump_indent[iVar1] = '\0';
  printf("%sopcode %d, name \"%s\", size %d\n",dump_cb::dump_indent,(ulong)ppVar2->opcode,
         ppVar2->name,(ulong)*(ushort *)(*(long *)(in_RDI + 8) + 2));
  if (**(short **)(in_RDI + 8) == 0x43) {
    printf("    => vertex palette size: %d\n",(ulong)**(uint **)(*(long *)(in_RDI + 8) + 8));
  }
  if ((int)((uint)*(ushort *)(in_RDI + 0x76) * 2) < 0) {
    local_28 = (uint)*(ushort *)(in_RDI + 0x76) * -2;
  }
  else {
    local_28 = (uint)*(ushort *)(in_RDI + 0x76) << 1;
  }
  dump_cb::dump_indent[local_28] = ' ';
  return 1;
}

Assistant:

static
int
dump_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state;
    prf_nodeinfo_t * nodeinfo;
    static char dump_indent[] = "                                                                                                                                                                                                ";

    state = (prf_state_t *) sysdata;

    nodeinfo = prf_nodeinfo_get( state->node->opcode );
    assert( nodeinfo != NULL );

    dump_indent[ PRF_ABS( 2 * state->push_level ) ] = '\0';

    printf( "%sopcode %d, name \"%s\", size %d\n", dump_indent,
            nodeinfo->opcode, nodeinfo->name,
            state->node->length );

    if ( state->node->opcode == 67 )
        printf( "    => vertex palette size: %d\n",
            ((uint32_t *)(state->node->data))[0] );

    dump_indent[ PRF_ABS( 2 * state->push_level ) ] = ' ';

    return PRF_TRAV_CONTINUE;
}